

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testparser.c
# Opt level: O1

void main_cold_2(void)

{
  fwrite("xmlReadDoc failed\n",0x12,1,_stderr);
  return;
}

Assistant:

static int
testStandaloneWithEncoding(void) {
    xmlDocPtr doc;
    const char *str =
        "<?xml version=\"1.0\" standalone=\"yes\"?>\n"
        "<doc></doc>\n";
    int err = 0;

    xmlResetLastError();

    doc = xmlReadDoc(BAD_CAST str, NULL, "UTF-8", 0);
    if (doc == NULL) {
        fprintf(stderr, "xmlReadDoc failed\n");
        err = 1;
    }
    xmlFreeDoc(doc);

    return err;
}